

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall Highs::formStandardFormLp(Highs *this)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  int *__a;
  reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  long in_RDI;
  double dVar7;
  HighsInt iRow_1;
  HighsInt iX;
  HighsInt iEl_2;
  HighsInt iEl_1;
  HighsInt iEl;
  double upper_2;
  double lower_2;
  double cost;
  HighsInt iCol_2;
  double upper_1;
  double lower_1;
  HighsInt iCol_1;
  HighsInt standard_form_row_2;
  HighsInt standard_form_row_1;
  HighsInt standard_form_row;
  double upper;
  double lower;
  HighsInt iRow;
  vector<int,_std::allocator<int>_> slack_ix;
  HighsInt num_free_col;
  HighsInt num_upper_col;
  HighsInt num_lower_col;
  HighsInt num_boxed_col;
  HighsInt num_fixed_col;
  HighsInt num_free_row;
  HighsInt num_upper_row;
  HighsInt num_lower_row;
  HighsInt num_boxed_row;
  HighsInt num_fixed_row;
  HighsInt *num_nz;
  HighsSparseMatrix local_row;
  HighsInt local_row_min_nnz;
  HighsInt iCol;
  HighsInt sense;
  HighsSparseMatrix *matrix;
  HighsLp *lp;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  undefined4 in_stack_fffffffffffff9b0;
  int iVar8;
  undefined4 in_stack_fffffffffffff9b4;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  undefined4 in_stack_fffffffffffff9c0;
  int iVar9;
  undefined4 in_stack_fffffffffffff9c4;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  undefined4 in_stack_fffffffffffff9d8;
  HighsInt in_stack_fffffffffffff9dc;
  HighsSparseMatrix *in_stack_fffffffffffff9e0;
  HighsSparseMatrix *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb44;
  HighsSparseMatrix *in_stack_fffffffffffffb48;
  HighsSparseMatrix *in_stack_fffffffffffffb50;
  int local_450;
  int local_43c;
  int local_430;
  int local_42c;
  int local_40c;
  int local_37c;
  int local_114;
  vector<int,_std::allocator<int>_> local_110;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  HighsSparseMatrix *local_d0;
  int local_b4;
  undefined4 local_b0;
  vector<int,_std::allocator<int>_> local_a8 [3];
  int local_48;
  int local_38;
  
  clearStandardFormLp((Highs *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
  __a = (int *)(in_RDI + 0x138);
  HighsSparseMatrix::ensureRowwise(in_stack_fffffffffffffa80);
  iVar8 = *(int *)(in_RDI + 0x228);
  *(double *)(in_RDI + 0x1250) = (double)iVar8 * *(double *)(in_RDI + 0x230);
  for (local_38 = 0; local_38 < *__a; local_38 = local_38 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),(long)local_38);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
              );
  }
  *(undefined4 *)(in_RDI + 0x1288) = 2;
  *(int *)(in_RDI + 0x128c) = *__a;
  local_48 = 2;
  std::max<int>(__a,&local_48);
  HighsSparseMatrix::HighsSparseMatrix(in_stack_fffffffffffff9e0);
  HighsSparseMatrix::ensureRowwise(in_stack_fffffffffffffa80);
  local_b0 = 1;
  local_b4 = *__a;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
             CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
             CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
             CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_d0 = (HighsSparseMatrix *)std::vector<int,_std::allocator<int>_>::operator[](local_a8,1);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_a8,0);
  *pvVar4 = 0;
  local_d4 = 0;
  local_d8 = 0;
  local_dc = 0;
  local_e0 = 0;
  local_e4 = 0;
  local_e8 = 0;
  local_ec = 0;
  local_f0 = 0;
  local_f4 = 0;
  local_f8 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4d6534);
  for (local_114 = 0; local_114 < *(int *)(in_RDI + 0x13c); local_114 = local_114 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x188),(long)local_114)
    ;
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a0),(long)local_114)
    ;
    dVar2 = *pvVar5;
    if ((-INFINITY < dVar1) || (dVar2 < INFINITY)) {
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        if (-INFINITY < dVar1) {
          if (dVar2 < INFINITY) {
            local_d8 = local_d8 + 1;
            std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1270));
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x4d6aeb);
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x4d6b00);
            HighsSparseMatrix::getRow
                      (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                       (HighsInt *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (HighsInt *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                       (double *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
            HighsSparseMatrix::HighsSparseMatrix
                      (in_stack_fffffffffffff9e0,
                       (HighsSparseMatrix *)
                       CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
            HighsSparseMatrix::addRows
                      (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                       (int8_t *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
            HighsSparseMatrix::~HighsSparseMatrix
                      ((HighsSparseMatrix *)
                       CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       (value_type_conflict1 *)
                       CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
            std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1270));
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            HighsSparseMatrix::HighsSparseMatrix
                      (in_stack_fffffffffffff9e0,
                       (HighsSparseMatrix *)
                       CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
            HighsSparseMatrix::addRows
                      (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                       (int8_t *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
            HighsSparseMatrix::~HighsSparseMatrix
                      ((HighsSparseMatrix *)
                       CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       (value_type_conflict1 *)
                       CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          }
          else {
            local_dc = local_dc + 1;
            std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1270));
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x4d6982);
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x4d6997);
            HighsSparseMatrix::getRow
                      (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                       (HighsInt *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (HighsInt *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                       (double *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
            HighsSparseMatrix::HighsSparseMatrix
                      (in_stack_fffffffffffff9e0,
                       (HighsSparseMatrix *)
                       CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
            HighsSparseMatrix::addRows
                      (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                       (int8_t *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
            HighsSparseMatrix::~HighsSparseMatrix
                      ((HighsSparseMatrix *)
                       CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       (value_type_conflict1 *)
                       CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          }
        }
        else {
          local_e0 = local_e0 + 1;
          std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1270));
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                     (value_type_conflict2 *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          std::vector<int,_std::allocator<int>_>::data
                    ((vector<int,_std::allocator<int>_> *)0x4d67fe);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x4d6813);
          HighsSparseMatrix::getRow
                    (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                     (HighsInt *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                     (HighsInt *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                     (double *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
          HighsSparseMatrix::HighsSparseMatrix
                    (in_stack_fffffffffffff9e0,
                     (HighsSparseMatrix *)
                     CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          HighsSparseMatrix::addRows
                    (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                     (int8_t *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
          HighsSparseMatrix::~HighsSparseMatrix
                    ((HighsSparseMatrix *)
                     CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
        }
      }
      else {
        local_d4 = local_d4 + 1;
        in_stack_fffffffffffffb44 = local_114;
        in_stack_fffffffffffffb48 = local_d0;
        in_stack_fffffffffffffb50 =
             (HighsSparseMatrix *)
             std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x4d6665);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x4d667a);
        HighsSparseMatrix::getRow
                  (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                   (HighsInt *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                   (HighsInt *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                   (double *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
        HighsSparseMatrix::HighsSparseMatrix
                  (in_stack_fffffffffffff9e0,
                   (HighsSparseMatrix *)
                   CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        HighsSparseMatrix::addRows
                  (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                   (int8_t *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        HighsSparseMatrix::~HighsSparseMatrix
                  ((HighsSparseMatrix *)
                   CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      }
    }
    else {
      local_e4 = local_e4 + 1;
    }
  }
  for (local_37c = 0; local_37c < *__a; local_37c = local_37c + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x158),(long)local_37c)
    ;
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x170),(long)local_37c)
    ;
    if ((-INFINITY < dVar1) && (*pvVar5 < INFINITY)) {
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      *(int *)(in_RDI + 0x128c) = *(int *)(in_RDI + 0x128c) + 1;
      local_b4 = local_b4 + 1;
      in_stack_fffffffffffffa80 = (HighsSparseMatrix *)(local_a8 + 2);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa80,0);
      *pvVar4 = local_37c;
      iVar9 = *(int *)(in_RDI + 0x128c);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa80,1);
      *pvVar4 = iVar9 + -1;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffa0,0);
      *pvVar5 = 1.0;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffa0,1);
      *pvVar5 = 1.0;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_a8,1);
      *pvVar4 = 2;
      HighsSparseMatrix::HighsSparseMatrix
                (in_stack_fffffffffffff9e0,
                 (HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8))
      ;
      HighsSparseMatrix::addRows
                (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                 (int8_t *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      HighsSparseMatrix::~HighsSparseMatrix
                ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0))
      ;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
    }
  }
  HighsSparseMatrix::ensureColwise(in_stack_fffffffffffffa80);
  HighsSparseMatrix::ensureColwise(in_stack_fffffffffffffa80);
  for (local_40c = 0; local_40c < *__a; local_40c = local_40c + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),(long)local_40c)
    ;
    dVar7 = (double)iVar8 * *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x158),(long)local_40c)
    ;
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x170),(long)local_40c)
    ;
    dVar2 = *pvVar5;
    if (dVar1 <= -INFINITY) {
      if (INFINITY <= dVar2) {
        local_f8 = local_f8 + 1;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1298),(long)local_40c);
        for (local_43c = *pvVar4;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1298),
                                (long)(local_40c + 1)), local_43c < *pvVar4;
            local_43c = local_43c + 1) {
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x12c8),(long)local_43c);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                     (value_type_conflict2 *)
                     CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x12e0),(long)local_43c);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        std::vector<int,_std::allocator<int>_>::size
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x12c8));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      }
      else {
        local_f4 = local_f4 + 1;
        *(double *)(in_RDI + 0x1250) = dVar7 * dVar2 + *(double *)(in_RDI + 0x1250);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1258),
                            (long)local_40c);
        *pvVar5 = -dVar7;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1298),(long)local_40c);
        for (local_430 = *pvVar4;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1298),
                                (long)(local_40c + 1)), local_430 < *pvVar4;
            local_430 = local_430 + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x12e0),
                              (long)local_430);
          dVar1 = *pvVar5;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x12c8),(long)local_430
                             );
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1270),
                              (long)*pvVar4);
          *pvVar5 = -dVar1 * dVar2 + *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x12e0),
                              (long)local_430);
          vVar3 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x12e0),
                              (long)local_430);
          *pvVar5 = -vVar3;
        }
      }
    }
    else {
      if (INFINITY <= dVar2) {
        local_f0 = local_f0 + 1;
      }
      else if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        local_ec = local_ec + 1;
      }
      else {
        local_e8 = local_e8 + 1;
      }
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        *(double *)(in_RDI + 0x1250) = dVar7 * dVar1 + *(double *)(in_RDI + 0x1250);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1298),(long)local_40c);
        for (local_42c = *pvVar4;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1298),
                                (long)(local_40c + 1)), local_42c < *pvVar4;
            local_42c = local_42c + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x12e0),
                              (long)local_42c);
          dVar2 = *pvVar5;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x12c8),(long)local_42c
                             );
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1270),
                              (long)*pvVar4);
          *pvVar5 = -dVar2 * dVar1 + *pvVar5;
        }
      }
    }
  }
  for (local_450 = 0; sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_110),
      local_450 < (int)sVar6; local_450 = local_450 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_110,(long)local_450);
    iVar8 = *pvVar4;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
              );
    if (iVar8 < 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    }
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x12c8));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
              );
  }
  *(undefined1 *)(in_RDI + 0x1248) = 1;
  iVar8 = local_e8;
  iVar9 = local_dc;
  highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
               "Standard form LP obtained for LP with (free / lower / upper / boxed / fixed) variables (%d / %d / %d / %d / %d) and constraints (%d / %d / %d / %d / %d) \n"
               ,(ulong)local_f8,(ulong)local_f0,(ulong)local_f4,local_ec,local_e8,local_e4,local_dc,
               local_e0,local_d8,local_d4);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffff9c4,iVar9));
  HighsSparseMatrix::~HighsSparseMatrix
            ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffff9b4,iVar8));
  return kOk;
}

Assistant:

HighsStatus Highs::formStandardFormLp() {
  this->clearStandardFormLp();
  HighsLp& lp = this->model_.lp_;
  HighsSparseMatrix& matrix = lp.a_matrix_;
  // Ensure that the incumbent LP and standard form LP matrices are rowwise
  matrix.ensureRowwise();
  // Original rows are processed before columns, so that any original
  // boxed rows can be transformed to pairs of one-sided rows,
  // requiring the standard form matrix to be row-wise. The original
  // columns are assumed to come before any new columns, so their
  // costs (as a minimization) must be defined befor costs of new
  // columns.
  // Determine the objective scaling, and apply it to any offset
  HighsInt sense = HighsInt(lp.sense_);
  this->standard_form_offset_ = sense * lp.offset_;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    this->standard_form_cost_.push_back(sense * lp.col_cost_[iCol]);
  this->standard_form_matrix_.format_ = MatrixFormat::kRowwise;
  this->standard_form_matrix_.num_col_ = lp.num_col_;
  // Create a HighsSparseMatrix instance to store rows extracted from
  // the original constraint matrix
  HighsInt local_row_min_nnz = std::max(lp.num_col_, HighsInt(2));
  HighsSparseMatrix local_row;
  local_row.ensureRowwise();
  local_row.num_row_ = 1;
  local_row.num_col_ = lp.num_col_;
  local_row.index_.resize(local_row_min_nnz);
  local_row.value_.resize(local_row_min_nnz);
  local_row.start_.resize(2);
  HighsInt& num_nz = local_row.start_[1];
  local_row.start_[0] = 0;
  HighsInt num_fixed_row = 0;
  HighsInt num_boxed_row = 0;
  HighsInt num_lower_row = 0;
  HighsInt num_upper_row = 0;
  HighsInt num_free_row = 0;
  HighsInt num_fixed_col = 0;
  HighsInt num_boxed_col = 0;
  HighsInt num_lower_col = 0;
  HighsInt num_upper_col = 0;
  HighsInt num_free_col = 0;
  std::vector<HighsInt> slack_ix;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    double lower = lp.row_lower_[iRow];
    double upper = lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      assert(0 == 1);
      // Free row
      num_free_row++;
      continue;
    }
    if (lower == upper) {
      // Equality row
      num_fixed_row++;
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
      continue;
    } else if (lower <= -kHighsInf) {
      // Upper bounded row, so record the slack
      num_upper_row++;
      assert(upper < kHighsInf);
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(standard_form_row + 1);
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    } else if (upper >= kHighsInf) {
      // Lower bounded row, so record the slack
      num_lower_row++;
      assert(lower > -kHighsInf);
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(-(standard_form_row + 1));
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(lower);
    } else {
      // Boxed row, so record the lower slack
      assert(lower > -kHighsInf);
      assert(upper < kHighsInf);
      num_boxed_row++;
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(-(standard_form_row + 1));
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(lower);
      // .. and upper slack, adding a copy of the row
      standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(standard_form_row + 1);
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    }
  }
  // Add rows corresponding to boxed columns
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    if (lower > -kHighsInf && upper < kHighsInf) {
      // Boxed column
      //
      // x will be replaced by x = l + X (below) with X >= 0
      //
      // Introduce variable s >= 0 so that (with x >= l still)
      //
      // x = u - s => x + s = u
      this->standard_form_cost_.push_back(0);
      this->standard_form_matrix_.num_col_++;
      local_row.num_col_++;
      local_row.index_[0] = iCol;
      local_row.index_[1] = this->standard_form_matrix_.num_col_ - 1;
      local_row.value_[0] = 1;
      local_row.value_[1] = 1;
      local_row.start_[1] = 2;
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    }
  }
  // Finished with both matrices, row-wise, so ensure that the
  // incumbent matrix leaves col-wise, and that the standard form
  // matrix is col-wise so RHS shifts can be applied and more columns
  // can be added
  matrix.ensureColwise();
  this->standard_form_matrix_.ensureColwise();
  // Work through the columns, ensuring that all have non-negativity bounds
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double cost = sense * lp.col_cost_[iCol];
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    if (lower > -kHighsInf) {
      // Finite lower bound
      if (upper < kHighsInf) {
        if (lower == upper) {
          // Fixed column
          num_fixed_col++;
        } else {
          // Boxed column
          num_boxed_col++;
        }
      } else {
        // Lower column
        num_lower_col++;
      }
      if (lower != 0) {
        // x >= l, so shift x-l = X >= 0, giving x = X + l
        //
        // Cost contribution c(X+l) = cX + cl
        this->standard_form_offset_ += cost * lower;
        // Constraint contribution a(X+l) = aX + al
        for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
             iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++)
          this->standard_form_rhs_[this->standard_form_matrix_.index_[iEl]] -=
              this->standard_form_matrix_.value_[iEl] * lower;
      }
    } else if (upper < kHighsInf) {
      // Upper column
      num_upper_col++;
      // Have to operate even if u=0, since cost and column values are negated
      //
      // x <= u, so shift u-x = X >= 0, giving x = u - X
      //
      // Cost contribution c(u-X) = cu - cX
      this->standard_form_offset_ += cost * upper;
      this->standard_form_cost_[iCol] = -cost;
      // Constraint contribution a(u-X) = -aX + au
      for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
           iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++) {
        this->standard_form_rhs_[this->standard_form_matrix_.index_[iEl]] -=
            this->standard_form_matrix_.value_[iEl] * upper;
        this->standard_form_matrix_.value_[iEl] =
            -this->standard_form_matrix_.value_[iEl];
      }
    } else {
      // Free column
      num_free_col++;
      // Represent as x = x+ - x-
      //
      // where original column is now x+ >= 0
      //
      // and x- >= 0 has negation of its cost and matrix column
      this->standard_form_cost_.push_back(-cost);
      for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
           iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++) {
        this->standard_form_matrix_.index_.push_back(
            this->standard_form_matrix_.index_[iEl]);
        this->standard_form_matrix_.value_.push_back(
            -this->standard_form_matrix_.value_[iEl]);
      }
      this->standard_form_matrix_.start_.push_back(
          HighsInt(this->standard_form_matrix_.index_.size()));
    }
  }
  // Now add the slack variables
  for (HighsInt iX = 0; iX < HighsInt(slack_ix.size()); iX++) {
    HighsInt iRow = slack_ix[iX];
    this->standard_form_cost_.push_back(0);
    if (iRow > 0) {
      this->standard_form_matrix_.index_.push_back(iRow - 1);
      this->standard_form_matrix_.value_.push_back(1);
    } else {
      this->standard_form_matrix_.index_.push_back(-iRow - 1);
      this->standard_form_matrix_.value_.push_back(-1);
    }
    this->standard_form_matrix_.start_.push_back(
        HighsInt(this->standard_form_matrix_.index_.size()));
  }
  this->standard_form_valid_ = true;
  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "Standard form LP obtained for LP with (free / lower / upper / "
               "boxed / fixed) variables"
               " (%d / %d / %d / %d / %d) and constraints"
               " (%d / %d / %d / %d / %d) \n",
               int(num_free_col), int(num_lower_col), int(num_upper_col),
               int(num_boxed_col), int(num_fixed_col), int(num_free_row),
               int(num_lower_row), int(num_upper_row), int(num_boxed_row),
               int(num_fixed_row));
  return HighsStatus::kOk;
}